

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.cpp
# Opt level: O0

ConstantValue *
(anonymous_namespace)::evalLogicalOp<bool,slang::SVInt>(BinaryOperator op,bool *l,SVInt *r)

{
  logic_t lVar1;
  SVInt *pSVar2;
  byte *in_RDX;
  int in_ESI;
  ConstantValue *in_RDI;
  SVInt *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  SVInt *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  logic_t in_stack_ffffffffffffff27;
  undefined1 in_stack_ffffffffffffff56;
  SVInt local_88;
  uint8_t local_71;
  logic_t local_5a;
  uint8_t local_59;
  logic_t local_32;
  uint8_t local_31;
  
  pSVar2 = (SVInt *)(ulong)(in_ESI - 0x13);
  switch(pSVar2) {
  case (SVInt *)0x0:
    slang::logic_t::logic_t(&local_32,*in_RDX & 1);
    local_31 = (uint8_t)slang::operator&&((logic_t)in_stack_ffffffffffffff56,pSVar2);
    slang::SVInt::SVInt(in_stack_ffffffffffffff18,in_stack_ffffffffffffff27);
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08);
    slang::SVInt::~SVInt
              ((SVInt *)CONCAT17(in_stack_ffffffffffffff27.value,in_stack_ffffffffffffff20));
    break;
  case (SVInt *)0x1:
    slang::logic_t::logic_t(&local_5a,*in_RDX & 1);
    local_59 = (uint8_t)slang::operator||((logic_t)in_stack_ffffffffffffff56,pSVar2);
    slang::SVInt::SVInt(in_stack_ffffffffffffff18,in_stack_ffffffffffffff27);
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08);
    slang::SVInt::~SVInt
              ((SVInt *)CONCAT17(in_stack_ffffffffffffff27.value,in_stack_ffffffffffffff20));
    break;
  case (SVInt *)0x2:
    pSVar2 = &local_88;
    slang::SVInt::SVInt<bool>
              ((SVInt *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
               SUB81((ulong)in_stack_ffffffffffffff08 >> 0x38,0));
    lVar1 = slang::SVInt::logicalImpl
                      (pSVar2,(SVInt *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10)
                      );
    local_71 = lVar1.value;
    slang::SVInt::SVInt(pSVar2,lVar1);
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08);
    slang::SVInt::~SVInt((SVInt *)CONCAT17(lVar1.value,in_stack_ffffffffffffff20));
    slang::SVInt::~SVInt((SVInt *)CONCAT17(lVar1.value,in_stack_ffffffffffffff20));
    break;
  case (SVInt *)0x3:
    pSVar2 = (SVInt *)&stack0xffffffffffffff50;
    slang::SVInt::SVInt<bool>
              ((SVInt *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
               SUB81((ulong)pSVar2 >> 0x38,0));
    lVar1 = slang::SVInt::logicalEquiv
                      (in_stack_ffffffffffffff18,
                       (SVInt *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    slang::SVInt::SVInt(in_stack_ffffffffffffff18,in_stack_ffffffffffffff27);
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)CONCAT17(lVar1.value,in_stack_ffffffffffffff10),pSVar2);
    slang::SVInt::~SVInt
              ((SVInt *)CONCAT17(in_stack_ffffffffffffff27.value,in_stack_ffffffffffffff20));
    slang::SVInt::~SVInt
              ((SVInt *)CONCAT17(in_stack_ffffffffffffff27.value,in_stack_ffffffffffffff20));
    break;
  default:
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08);
  }
  return in_RDI;
}

Assistant:

ConstantValue evalLogicalOp(BinaryOperator op, const TL& l, const TR& r) {
    switch (op) {
        OP(LogicalAnd, SVInt(logic_t(l) && r));
        OP(LogicalOr, SVInt(logic_t(l) || r));
        OP(LogicalImplication, SVInt(SVInt::logicalImpl(l, r)));
        OP(LogicalEquivalence, SVInt(SVInt::logicalEquiv(l, r)));
        default:
            // This should only be reachable when speculatively
            // evaluating an expression that hasn't had its
            // type finalized via propagation, which can happen
            // during an analyzeOpTypes call.
            return nullptr;
    }
}